

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O1

void __thiscall read_env_var::test_method(read_env_var *this)

{
  bool bVar1;
  undefined1 local_11a8 [32];
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  undefined4 local_1164;
  undefined **local_1160;
  ulong local_1158;
  shared_count sStack_1150;
  long **local_1148;
  EventRegistry registry;
  long local_1128;
  LicenseReader licenseReader;
  long *local_1100;
  undefined4 *local_10f8;
  undefined1 local_10f0;
  undefined8 local_10e8;
  shared_count sStack_10e0;
  undefined **local_10d8;
  char *local_10d0;
  undefined1 *local_10c8;
  char *local_10c0;
  undefined1 *local_10b8;
  undefined1 *local_10b0;
  char *local_10a8;
  char *local_10a0;
  char *local_1098;
  char *local_1090;
  undefined1 *local_1088;
  undefined1 *local_1080;
  char *local_1078;
  char *local_1070;
  char *local_1068;
  char *local_1060;
  LicenseLocation location;
  char str [4096];
  
  memcpy(str,
         "LIC_VAR=/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/test_reader.ini"
         ,0x7c);
  putenv(str);
  location.openFileNearModule = false;
  location._17_7_ = 0;
  location.licenseFileLocation = (char *)0x0;
  location.environmentVariableName = "LIC_VAR";
  license::LicenseReader::LicenseReader(&licenseReader,&location);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_11a8._0_8_ = local_11a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"PrODUCT","");
  license::LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_11a8,&licenseInfos);
  if ((undefined1 *)local_11a8._0_8_ != local_11a8 + 0x10) {
    operator_delete((void *)local_11a8._0_8_);
  }
  local_1078 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1070 = "";
  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1078,0x4c);
  bVar1 = license::EventRegistry::isGood(&registry);
  local_1160 = (undefined **)CONCAT71(local_1160._1_7_,bVar1);
  local_1158 = 0;
  sStack_1150.pi_ = (sp_counted_base *)0x0;
  local_11a8._24_8_ = &local_10d8;
  local_10d8 = (undefined **)0x47b0f6;
  local_10d0 = "";
  local_11a8[8] = 0;
  local_11a8._0_8_ = &PTR__lazy_ostream_0059be90;
  local_11a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1098 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1090 = "";
  boost::test_tools::tt_detail::report_assertion(&local_1160,local_11a8,&local_1098,0x4c,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1150);
  local_10a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_10a0 = "";
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_10a8,0x4d);
  local_10d0 = (char *)((ulong)local_10d0 & 0xffffffffffffff00);
  local_10d8 = &PTR__lazy_ostream_0059bf08;
  local_10c8 = boost::unit_test::lazy_ostream::inst;
  local_10c0 = "";
  local_10f8 = &local_1164;
  local_1164 = 1;
  local_1128 = (long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 8;
  local_1100 = &local_1128;
  local_10f0 = (long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)licenseInfos.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x100;
  local_10e8 = 0;
  sStack_10e0.pi_ = (sp_counted_base *)0x0;
  local_1068 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1060 = "";
  local_11a8._24_8_ = &local_10f8;
  local_11a8[8] = 0;
  local_11a8._0_8_ = &PTR__lazy_ostream_0059bf48;
  local_11a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1148 = &local_1100;
  local_1158 = local_1158 & 0xffffffffffffff00;
  local_1160 = &PTR__lazy_ostream_0059bf88;
  sStack_1150.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_10e0);
  if (registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(registry.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&licenseInfos);
  license::LicenseReader::~LicenseReader(&licenseReader);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( read_env_var ) {
	char str[MAX_PATH];
	strcpy(str,"LIC_VAR=" PROJECT_TEST_SRC_DIR "/library/test_reader.ini");
	putenv(str);
	const LicenseLocation location = { NULL, "LIC_VAR", false };
	LicenseReader licenseReader(location);
	vector<FullLicenseInfo> licenseInfos;
	EventRegistry registry = licenseReader.readLicenses("PrODUCT",
			licenseInfos);
	BOOST_CHECK(registry.isGood());
	BOOST_CHECK_EQUAL(1, licenseInfos.size());
}